

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O3

__pid_t __thiscall
yamc::barrier<yamc::detail::default_barrier_completion>::wait
          (barrier<yamc::detail::default_barrier_completion> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mtx_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (this->phase_ <= *__stat_loc) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv_);
    } while (this->phase_ <= *__stat_loc);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return extraout_EAX;
}

Assistant:

void wait(arrival_token&& arrival) const
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (phase_ <= arrival.phase_) {
      cv_.wait(lk);
    }
  }